

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::update_gl_camera(Application *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3D *pVVar7;
  GLint view [4];
  undefined1 local_28 [8];
  int local_20;
  int local_1c;
  
  glGetIntegerv(0xba2,local_28);
  if ((this->screenW != (long)local_20) || (this->screenH != (long)local_1c)) {
    (*(this->super_Renderer)._vptr_Renderer[4])(this,(long)local_20,(long)local_1c);
  }
  glMatrixMode(0x1700);
  glLoadIdentity();
  dVar1 = (this->camera).pos.x;
  dVar2 = (this->camera).pos.y;
  dVar3 = (this->camera).pos.z;
  dVar4 = (this->camera).targetPos.x;
  dVar5 = (this->camera).targetPos.y;
  dVar6 = (this->camera).targetPos.z;
  pVVar7 = Matrix3x3::operator[](&(this->camera).c2w,1);
  gluLookAt(dVar1,dVar2,dVar3,dVar4,dVar5,dVar6,pVVar7->x,pVVar7->y);
  return;
}

Assistant:

void Application::update_gl_camera() {
  // Call resize() every time we draw, since it doesn't seem
  // to get called by the Viewer upon initial window creation
  // (this should probably be fixed!).
  GLint view[4];
  glGetIntegerv(GL_VIEWPORT, view);
  if (view[2] != screenW || view[3] != screenH) {
    resize(view[2], view[3]);
  }

  // Control the camera to look at the mesh.
  glMatrixMode(GL_MODELVIEW);
  glLoadIdentity();

  const Vector3D &c = camera.position();
  const Vector3D &r = camera.view_point();
  const Vector3D &u = camera.up_dir();

  gluLookAt(c.x, c.y, c.z, r.x, r.y, r.z, u.x, u.y, u.z);
}